

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

void __thiscall JSONNode::merge(JSONNode *this,uint num,...)

{
  internalJSONNode *piVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_158;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  uint local_6c;
  uint local_68;
  uint i;
  va_list args;
  allocator local_39;
  json_string local_38;
  uint local_14;
  JSONNode *pJStack_10;
  uint num_local;
  JSONNode *this_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  piVar1 = this->internal;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  local_14 = num;
  pJStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  args[0].overflow_arg_area = local_128;
  args[0]._0_8_ = &stack0x00000008;
  i = 0x30;
  local_68 = 0x10;
  for (local_6c = 0; local_6c < local_14; local_6c = local_6c + 1) {
    if (local_68 < 0x29) {
      local_158 = (undefined8 *)((long)(int)local_68 + (long)args[0].overflow_arg_area);
      local_68 = local_68 + 8;
    }
    else {
      local_158 = (undefined8 *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    merge(this,(JSONNode *)*local_158);
  }
  return;
}

Assistant:

void JSONNode::merge(unsigned int, ...) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   va_list args;
	   va_start(args, num);
	   for(unsigned int i = 0; i < num; ++i){
		  merge(va_arg(args, JSONNode*));
	   }
	   va_end(args);
    #endif
}